

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.cc
# Opt level: O3

void __thiscall
prometheus::detail::MetricsHandler::RegisterCollectable
          (MetricsHandler *this,weak_ptr<prometheus::Collectable> *collectable)

{
  mutex *__mutex;
  undefined8 uVar1;
  int iVar2;
  
  __mutex = &this->collectables_mutex_;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    CleanupStalePointers(&this->collectables_);
    std::
    vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
    ::push_back(&this->collectables_,collectable);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar1 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar1);
}

Assistant:

void MetricsHandler::RegisterCollectable(
    const std::weak_ptr<Collectable>& collectable) {
  std::lock_guard<std::mutex> lock{collectables_mutex_};
  CleanupStalePointers(collectables_);
  collectables_.push_back(collectable);
}